

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

void sym_Purge(char *symName)

{
  Symbol *key;
  char *fmt;
  
  key = sym_FindScopedValidSymbol(symName);
  if (key == (Symbol *)0x0) {
    fmt = "\'%s\' not defined\n";
  }
  else if (key->isBuiltin == true) {
    fmt = "Built-in symbol \'%s\' cannot be purged\n";
  }
  else {
    if (key->ID == 0xffffffff) {
      if (key == (Symbol *)labelScope) {
        labelScope = (char *)0x0;
      }
      hash_RemoveElement(symbols,key->name);
      free(key);
      return;
    }
    fmt = "Symbol \"%s\" is referenced and thus cannot be purged\n";
  }
  error(fmt,symName);
  return;
}

Assistant:

void sym_Purge(char const *symName)
{
	struct Symbol *sym = sym_FindScopedValidSymbol(symName);

	if (!sym) {
		error("'%s' not defined\n", symName);
	} else if (sym->isBuiltin) {
		error("Built-in symbol '%s' cannot be purged\n", symName);
	} else if (isReferenced(sym)) {
		error("Symbol \"%s\" is referenced and thus cannot be purged\n", symName);
	} else {
		// Do not keep a reference to the label's name after purging it
		if (sym->name == labelScope)
			sym_SetCurrentSymbolScope(NULL);

		// FIXME: this leaks sym->macro for SYM_EQUS and SYM_MACRO, but this can't
		// free(sym->macro) because the expansion may be purging itself.
		hash_RemoveElement(symbols, sym->name);
		// TODO: ideally, also unref the file stack nodes
		free(sym);
	}
}